

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

tmbstr GensymClass(TidyDocImpl *doc)

{
  tmbstr ptVar1;
  char *local_220;
  ctmbstr pfx;
  tmbchar buf [512];
  TidyDocImpl *doc_local;
  
  local_220 = (doc->config).value[10].p;
  if ((local_220 == (char *)0x0) || (*local_220 == '\0')) {
    local_220 = anon_var_dwarf_40e7a + 0x22;
  }
  doc->nClassId = doc->nClassId + 1;
  prvTidytmbsnprintf((tmbstr)&pfx,0x200,"%s%u",local_220);
  ptVar1 = prvTidytmbstrdup(doc->allocator,(ctmbstr)&pfx);
  return ptVar1;
}

Assistant:

static tmbstr GensymClass( TidyDocImpl* doc )
{
    tmbchar buf[512];  /* CSSPrefix is limited to 256 characters */
    ctmbstr pfx = cfgStr(doc, TidyCSSPrefix);
    if ( pfx == NULL || *pfx == 0 )
      pfx = "c";

    TY_(tmbsnprintf)(buf, sizeof(buf), "%s%u", pfx, ++doc->nClassId );
    return TY_(tmbstrdup)(doc->allocator, buf);
}